

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O2

Abc_Ntk_t *
Abc_NtkMiterBm(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,Vec_Ptr_t *iCurrMatch,Vec_Ptr_t *oCurrMatch)

{
  Abc_Aig_t *pAVar1;
  Abc_Ntk_t *pNtk;
  char *pcVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  void *pvVar5;
  Abc_Obj_t *pAVar6;
  Vec_Ptr_t *p;
  int iVar7;
  int iVar8;
  char Buffer [1000];
  
  pNtk = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  iVar7 = 0;
  sprintf(Buffer,"%s_%s_miter",pNtk1->pName,pNtk2->pName);
  pcVar2 = Extra_UtilStrsav(Buffer);
  pNtk->pName = pcVar2;
  pAVar3 = Abc_AigConst1(pNtk);
  pAVar4 = Abc_AigConst1(pNtk1);
  (pAVar4->field_6).pCopy = pAVar3;
  pAVar3 = Abc_AigConst1(pNtk);
  pAVar4 = Abc_AigConst1(pNtk2);
  (pAVar4->field_6).pCopy = pAVar3;
  if (iCurrMatch == (Vec_Ptr_t *)0x0) {
    for (iVar7 = 0; iVar7 < pNtk1->vCis->nSize; iVar7 = iVar7 + 1) {
      pAVar3 = Abc_NtkCi(pNtk1,iVar7);
      pAVar4 = Abc_NtkCreatePi(pNtk);
      (pAVar3->field_6).pCopy = pAVar4;
      pAVar3 = Abc_NtkCi(pNtk2,iVar7);
      (pAVar3->field_6).pCopy = pAVar4;
      pcVar2 = Abc_ObjName(pAVar3);
      Abc_ObjAssignName(pAVar4,pcVar2,(char *)0x0);
    }
  }
  else {
    for (; iVar7 < iCurrMatch->nSize; iVar7 = iVar7 + 2) {
      pAVar3 = Abc_NtkCreatePi(pNtk);
      pvVar5 = Vec_PtrEntry(iCurrMatch,iVar7);
      *(Abc_Obj_t **)((long)pvVar5 + 0x40) = pAVar3;
      pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(iCurrMatch,iVar7 + 1);
      (pAVar4->field_6).pCopy = pAVar3;
      pcVar2 = Abc_ObjName(pAVar4);
      Abc_ObjAssignName(pAVar3,pcVar2,(char *)0x0);
    }
  }
  pAVar3 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
  iVar8 = 0;
  Abc_ObjAssignName(pAVar3,"miter",(char *)0x0);
  iVar7 = Abc_NtkIsDfsOrdered(pNtk1);
  if (iVar7 != 0) {
    for (; iVar8 < pNtk1->vObjs->nSize; iVar8 = iVar8 + 1) {
      pAVar3 = Abc_NtkObj(pNtk1,iVar8);
      if ((pAVar3 != (Abc_Obj_t *)0x0) && (iVar7 = Abc_AigNodeIsAnd(pAVar3), iVar7 != 0)) {
        pAVar1 = (Abc_Aig_t *)pNtk->pManFunc;
        pAVar4 = Abc_ObjChild0Copy(pAVar3);
        pAVar6 = Abc_ObjChild1Copy(pAVar3);
        pAVar4 = Abc_AigAnd(pAVar1,pAVar4,pAVar6);
        (pAVar3->field_6).pCopy = pAVar4;
      }
    }
    iVar7 = Abc_NtkIsDfsOrdered(pNtk2);
    if (iVar7 == 0) {
      __assert_fail("Abc_NtkIsDfsOrdered(pNtk2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcBm.c"
                    ,0x2fc,
                    "Abc_Ntk_t *Abc_NtkMiterBm(Abc_Ntk_t *, Abc_Ntk_t *, Vec_Ptr_t *, Vec_Ptr_t *)")
      ;
    }
    for (iVar7 = 0; iVar7 < pNtk2->vObjs->nSize; iVar7 = iVar7 + 1) {
      pAVar3 = Abc_NtkObj(pNtk2,iVar7);
      if ((pAVar3 != (Abc_Obj_t *)0x0) && (iVar8 = Abc_AigNodeIsAnd(pAVar3), iVar8 != 0)) {
        pAVar1 = (Abc_Aig_t *)pNtk->pManFunc;
        pAVar4 = Abc_ObjChild0Copy(pAVar3);
        pAVar6 = Abc_ObjChild1Copy(pAVar3);
        pAVar4 = Abc_AigAnd(pAVar1,pAVar4,pAVar6);
        (pAVar3->field_6).pCopy = pAVar4;
      }
    }
    p = Vec_PtrAlloc(100);
    if (oCurrMatch == (Vec_Ptr_t *)0x0) {
      for (iVar7 = 0; iVar7 < pNtk1->vCos->nSize; iVar7 = iVar7 + 1) {
        pAVar3 = Abc_NtkCo(pNtk1,iVar7);
        pAVar3 = Abc_ObjChild0Copy(pAVar3);
        Vec_PtrPush(p,pAVar3);
        pAVar3 = Abc_NtkCo(pNtk2,iVar7);
        pAVar3 = Abc_ObjChild0Copy(pAVar3);
        Vec_PtrPush(p,pAVar3);
      }
    }
    else {
      for (iVar7 = 0; iVar7 < oCurrMatch->nSize; iVar7 = iVar7 + 2) {
        pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(oCurrMatch,iVar7);
        pAVar3 = Abc_ObjChild0Copy(pAVar3);
        Vec_PtrPush(p,pAVar3);
        pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(oCurrMatch,iVar7 + 1);
        pAVar3 = Abc_ObjChild0Copy(pAVar3);
        Vec_PtrPush(p,pAVar3);
      }
    }
    pAVar3 = Abc_AigMiter((Abc_Aig_t *)pNtk->pManFunc,p,0);
    pAVar4 = Abc_NtkPo(pNtk,0);
    Abc_ObjAddFanin(pAVar4,pAVar3);
    Vec_PtrFree(p);
    return pNtk;
  }
  __assert_fail("Abc_NtkIsDfsOrdered(pNtk1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcBm.c"
                ,0x2f3,
                "Abc_Ntk_t *Abc_NtkMiterBm(Abc_Ntk_t *, Abc_Ntk_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkMiterBm( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, Vec_Ptr_t * iCurrMatch, Vec_Ptr_t * oCurrMatch )
{
    char Buffer[1000];
    Abc_Ntk_t * pNtkMiter;

    pNtkMiter = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    sprintf( Buffer, "%s_%s_miter", pNtk1->pName, pNtk2->pName );
    pNtkMiter->pName = Extra_UtilStrsav(Buffer);

    //Abc_NtkMiterPrepare( pNtk1, pNtk2, pNtkMiter, fComb, nPartSize );
    {
        Abc_Obj_t * pObj, * pObjNew;
        int i;

        Abc_AigConst1(pNtk1)->pCopy = Abc_AigConst1(pNtkMiter);
        Abc_AigConst1(pNtk2)->pCopy = Abc_AigConst1(pNtkMiter);

        // create new PIs and remember them in the old PIs
        if(iCurrMatch == NULL)
        {
            Abc_NtkForEachCi( pNtk1, pObj, i )
            {
                pObjNew = Abc_NtkCreatePi( pNtkMiter );
                // remember this PI in the old PIs
                pObj->pCopy = pObjNew;
                pObj = Abc_NtkCi(pNtk2, i);  
                pObj->pCopy = pObjNew;
                // add name
                Abc_ObjAssignName( pObjNew, Abc_ObjName(pObj), NULL );
            }
        }
        else
        {
            for(i = 0; i < Vec_PtrSize( iCurrMatch ); i += 2)
            {
                pObjNew = Abc_NtkCreatePi( pNtkMiter );
                pObj = (Abc_Obj_t *)Vec_PtrEntry(iCurrMatch, i);
                pObj->pCopy = pObjNew;
                pObj = (Abc_Obj_t *)Vec_PtrEntry(iCurrMatch, i+1);
                pObj->pCopy = pObjNew;
                // add name
                Abc_ObjAssignName( pObjNew, Abc_ObjName(pObj), NULL );
            }
        }

        // create the only PO
        pObjNew = Abc_NtkCreatePo( pNtkMiter );
        // add the PO name
        Abc_ObjAssignName( pObjNew, "miter", NULL );
    }

    // Abc_NtkMiterAddOne( pNtk1, pNtkMiter );
    {
        Abc_Obj_t * pNode;
        int i;
        assert( Abc_NtkIsDfsOrdered(pNtk1) );
        Abc_AigForEachAnd( pNtk1, pNode, i )
            pNode->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkMiter->pManFunc, Abc_ObjChild0Copy(pNode), Abc_ObjChild1Copy(pNode) );
    }

    // Abc_NtkMiterAddOne( pNtk2, pNtkMiter );
    {
        Abc_Obj_t * pNode;
        int i;
        assert( Abc_NtkIsDfsOrdered(pNtk2) );
        Abc_AigForEachAnd( pNtk2, pNode, i )
            pNode->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkMiter->pManFunc, Abc_ObjChild0Copy(pNode), Abc_ObjChild1Copy(pNode) );
    }
    
    // Abc_NtkMiterFinalize( pNtk1, pNtk2, pNtkMiter, fComb, nPartSize );    
    {
        Vec_Ptr_t * vPairs;
        Abc_Obj_t * pMiter;
        int i;

        vPairs = Vec_PtrAlloc( 100 );
        
        // collect the CO nodes for the miter
        if(oCurrMatch != NULL)
        {
            for(i = 0; i < Vec_PtrSize( oCurrMatch ); i += 2)
            {
                Vec_PtrPush( vPairs, Abc_ObjChild0Copy((Abc_Obj_t *)Vec_PtrEntry(oCurrMatch, i)) );
                Vec_PtrPush( vPairs, Abc_ObjChild0Copy((Abc_Obj_t *)Vec_PtrEntry(oCurrMatch, i+1)) );
            }
        }
        else
        {
            Abc_Obj_t * pNode;

            Abc_NtkForEachCo( pNtk1, pNode, i )
            {
                Vec_PtrPush( vPairs, Abc_ObjChild0Copy(pNode) );
                pNode = Abc_NtkCo( pNtk2, i );
                Vec_PtrPush( vPairs, Abc_ObjChild0Copy(pNode) );
            }
        }
        
     pMiter = Abc_AigMiter( (Abc_Aig_t *)pNtkMiter->pManFunc, vPairs, 0 );
     Abc_ObjAddFanin( Abc_NtkPo(pNtkMiter,0), pMiter );
     Vec_PtrFree(vPairs);
    }

    //Abc_AigCleanup(pNtkMiter->pManFunc);
    
    return pNtkMiter;
}